

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O3

int ravi_optlevel(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  
  iVar1 = lua_gettop(L);
  iVar2 = raviV_getoptlevel(L);
  if (iVar1 == 1) {
    lVar3 = lua_tointegerx(L,1,(int *)0x0);
    raviV_setoptlevel(L,(int)lVar3);
  }
  lua_pushinteger(L,(long)iVar2);
  return 1;
}

Assistant:

static int ravi_optlevel(lua_State *L) {
  int n = lua_gettop(L);
  int oldvalue = raviV_getoptlevel(L);
  if (n == 1) {
    int value = lua_tointeger(L, 1);
    raviV_setoptlevel(L, value);
  }
  lua_pushinteger(L, oldvalue);
  return 1;
}